

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteSourceProperty
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmSourceFile *sf,string *propName,
          string *propFlag)

{
  cmValue cVar1;
  ostream *poVar2;
  string *p;
  pointer pbVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar1 = cmSourceFile::GetProperty(sf,propName);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_50,(string *)cVar1.Value);
    init._M_len = 1;
    init._M_array = &local_50;
    cmList::cmList(&list,init);
    std::__cxx11::string::~string((string *)&local_50);
    for (pbVar3 = list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      poVar2 = std::operator<<(fout,"    ");
      poVar2 = std::operator<<(poVar2,(string *)propFlag);
      poVar2 = std::operator<<(poVar2,(string *)pbVar3);
      std::operator<<(poVar2,'\n');
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list.Values);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSourceProperty(
  std::ostream& fout, const cmSourceFile* sf, std::string const& propName,
  std::string const& propFlag)
{
  cmValue prop = sf->GetProperty(propName);
  if (prop) {
    cmList list{ *prop };
    for (const std::string& p : list) {
      fout << "    " << propFlag << p << '\n';
    }
  }
}